

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrix3x3.h
# Opt level: O2

void __thiscall btMatrix3x3::getRotation(btMatrix3x3 *this,btQuaternion *q)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  btScalar local_48 [4];
  btQuaternion *local_38;
  
  fVar9 = this->m_el[0].m_floats[0];
  fVar1 = this->m_el[1].m_floats[1];
  fVar2 = this->m_el[2].m_floats[2];
  fVar8 = fVar9 + fVar1 + fVar2;
  if (fVar8 <= 0.0) {
    uVar7 = (uint)(fVar9 < fVar2) * 2;
    if (fVar9 < fVar1) {
      uVar7 = (fVar1 < fVar2) + 1;
    }
    iVar4 = uVar7 + 1;
    if (uVar7 + 1 == 3) {
      iVar4 = 0;
    }
    uVar3 = (ulong)(uVar7 + 2) % 3;
    uVar6 = (ulong)uVar7;
    lVar5 = (long)iVar4;
    uVar7 = (int)uVar3 << 4;
    fVar9 = ((*(float *)((long)this->m_el + uVar6 * 0x14) -
             *(float *)((long)this->m_el + lVar5 * 0x14)) -
            *(float *)((long)this->m_el[0].m_floats + uVar3 * 4 + (ulong)uVar7)) + 1.0;
    if (fVar9 < 0.0) {
      local_38 = q;
      fVar9 = sqrtf(fVar9);
      q = local_38;
    }
    else {
      fVar9 = SQRT(fVar9);
    }
    local_48[uVar6] = fVar9 * 0.5;
    fVar9 = 0.5 / fVar9;
    local_48[3] = (*(float *)((long)this->m_el[0].m_floats + lVar5 * 4 + (ulong)uVar7) -
                  this->m_el[lVar5].m_floats[uVar3]) * fVar9;
    local_48[lVar5] =
         (this->m_el[lVar5].m_floats[uVar6] + this->m_el[uVar6].m_floats[lVar5]) * fVar9;
    local_48[uVar3] =
         (*(float *)((long)this->m_el[0].m_floats + uVar6 * 4 + (ulong)uVar7) +
         this->m_el[uVar6].m_floats[uVar3]) * fVar9;
  }
  else {
    fVar8 = fVar8 + 1.0;
    if (fVar8 < 0.0) {
      fVar8 = sqrtf(fVar8);
    }
    else {
      fVar8 = SQRT(fVar8);
    }
    fVar9 = 0.5 / fVar8;
    local_48[0] = (this->m_el[2].m_floats[1] - this->m_el[1].m_floats[2]) * fVar9;
    local_48[1] = (this->m_el[0].m_floats[2] - this->m_el[2].m_floats[0]) * fVar9;
    local_48[2] = (this->m_el[1].m_floats[0] - this->m_el[0].m_floats[1]) * fVar9;
    local_48[3] = fVar8 * 0.5;
  }
  (q->super_btQuadWord).m_floats[0] = local_48[0];
  (q->super_btQuadWord).m_floats[1] = local_48[1];
  (q->super_btQuadWord).m_floats[2] = local_48[2];
  (q->super_btQuadWord).m_floats[3] = local_48[3];
  return;
}

Assistant:

void getRotation(btQuaternion& q) const
	{
#if (defined (BT_USE_SSE_IN_API) && defined (BT_USE_SSE))|| defined (BT_USE_NEON)
        btScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();
        btScalar s, x;
        
        union {
            btSimdFloat4 vec;
            btScalar f[4];
        } temp;
        
        if (trace > btScalar(0.0)) 
        {
            x = trace + btScalar(1.0);

            temp.f[0]=m_el[2].y() - m_el[1].z();
            temp.f[1]=m_el[0].z() - m_el[2].x();
            temp.f[2]=m_el[1].x() - m_el[0].y();
            temp.f[3]=x;
            //temp.f[3]= s * btScalar(0.5);
        } 
        else 
        {
            int i, j, k;
            if(m_el[0].x() < m_el[1].y()) 
            { 
                if( m_el[1].y() < m_el[2].z() )
                    { i = 2; j = 0; k = 1; }
                else
                    { i = 1; j = 2; k = 0; }
            }
            else
            {
                if( m_el[0].x() < m_el[2].z())
                    { i = 2; j = 0; k = 1; }
                else
                    { i = 0; j = 1; k = 2; }
            }

            x = m_el[i][i] - m_el[j][j] - m_el[k][k] + btScalar(1.0);

            temp.f[3] = (m_el[k][j] - m_el[j][k]);
            temp.f[j] = (m_el[j][i] + m_el[i][j]);
            temp.f[k] = (m_el[k][i] + m_el[i][k]);
            temp.f[i] = x;
            //temp.f[i] = s * btScalar(0.5);
        }

        s = btSqrt(x);
        q.set128(temp.vec);
        s = btScalar(0.5) / s;

        q *= s;
#else    
		btScalar trace = m_el[0].x() + m_el[1].y() + m_el[2].z();

		btScalar temp[4];

		if (trace > btScalar(0.0)) 
		{
			btScalar s = btSqrt(trace + btScalar(1.0));
			temp[3]=(s * btScalar(0.5));
			s = btScalar(0.5) / s;

			temp[0]=((m_el[2].y() - m_el[1].z()) * s);
			temp[1]=((m_el[0].z() - m_el[2].x()) * s);
			temp[2]=((m_el[1].x() - m_el[0].y()) * s);
		} 
		else 
		{
			int i = m_el[0].x() < m_el[1].y() ? 
				(m_el[1].y() < m_el[2].z() ? 2 : 1) :
				(m_el[0].x() < m_el[2].z() ? 2 : 0); 
			int j = (i + 1) % 3;  
			int k = (i + 2) % 3;

			btScalar s = btSqrt(m_el[i][i] - m_el[j][j] - m_el[k][k] + btScalar(1.0));
			temp[i] = s * btScalar(0.5);
			s = btScalar(0.5) / s;

			temp[3] = (m_el[k][j] - m_el[j][k]) * s;
			temp[j] = (m_el[j][i] + m_el[i][j]) * s;
			temp[k] = (m_el[k][i] + m_el[i][k]) * s;
		}
		q.setValue(temp[0],temp[1],temp[2],temp[3]);
#endif
	}